

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_file.cpp
# Opt level: O0

ssize_t __thiscall Omega_h::binary::read(binary *this,int __fd,void *__buf,size_t __nbytes)

{
  element_type *this_00;
  Library *library_in;
  undefined4 in_register_00000034;
  shared_ptr<Omega_h::Comm> local_48 [2];
  undefined1 local_23;
  ScopedTimer local_22;
  byte local_21;
  ScopedTimer timer;
  void *pvStack_20;
  bool strict_local;
  CommPtr *comm_local;
  path *path_local;
  Mesh *mesh;
  
  local_21 = (byte)__nbytes & 1;
  pvStack_20 = __buf;
  ScopedTimer::ScopedTimer(&local_22,"binary::read(path, comm, strict)",(char *)0x0);
  local_23 = 0;
  this_00 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)__buf);
  library_in = Comm::library(this_00);
  Omega_h::Mesh::Mesh((Mesh *)this,library_in);
  std::shared_ptr<Omega_h::Comm>::shared_ptr(local_48,(shared_ptr<Omega_h::Comm> *)__buf);
  read((binary *)CONCAT44(in_register_00000034,__fd),(int)local_48,this,(ulong)(local_21 & 1));
  std::shared_ptr<Omega_h::Comm>::~shared_ptr(local_48);
  local_23 = 1;
  ScopedTimer::~ScopedTimer(&local_22);
  return (ssize_t)this;
}

Assistant:

Mesh read(filesystem::path const& path, CommPtr comm, bool strict) {
  ScopedTimer timer("binary::read(path, comm, strict)");
  auto mesh = Mesh(comm->library());
  binary::read(path, comm, &mesh, strict);
  return mesh;
}